

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoInline.cpp
# Opt level: O0

Pass * wasm::createNoPartialInlinePass(void)

{
  NoInline *this;
  
  this = (NoInline *)operator_new(0x60);
  anon_unknown_0::NoInline::NoInline(this,Partial);
  return &this->super_Pass;
}

Assistant:

Pass* createNoPartialInlinePass() {
  return new NoInline(NoInlineMode::Partial);
}